

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

bool boost::ext::ut::v1_1_8::detail::on<bool,boost::ext::ut::v1_1_8::events::assertion<bool>>
               (assertion<bool> *event)

{
  undefined8 uVar1;
  assertion_fail<bool> assertion;
  bool bVar2;
  undefined4 uStack_34;
  undefined4 local_2b;
  undefined2 local_27;
  undefined1 local_25;
  undefined1 uStack_11;
  undefined7 uStack_10;
  undefined4 uStack_9;
  
  uVar1 = *(undefined8 *)((long)&(event->location).file_ + 1);
  uStack_11 = (undefined1)((ulong)*(undefined8 *)&event->field_0x1 >> 0x38);
  uStack_10 = (undefined7)uVar1;
  uStack_9._1_3_ = (undefined3)((uint)(event->location).line_ >> 8);
  uStack_9._0_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  bVar2 = true;
  if (cfg<boost::ext::ut::v1_1_8::override>[0x3a0] == '\0') {
    if ((event->expr & 1U) == 0) {
      cfg<boost::ext::ut::v1_1_8::override>._616_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._616_8_ + 1;
      assertion.location.file_._1_7_ = uStack_10;
      assertion.location.file_._0_1_ = uStack_11;
      assertion.location._12_4_ = uStack_34;
      assertion.location.line_ = uStack_9;
      assertion._1_4_ = local_2b;
      assertion.expr = event->expr;
      assertion._5_2_ = local_27;
      assertion._7_1_ = local_25;
      reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)cfg<boost::ext::ut::v1_1_8::override>,
                 assertion);
      bVar2 = false;
    }
    else {
      cfg<boost::ext::ut::v1_1_8::override>._24_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._24_8_ + 1;
    }
  }
  return bVar2;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}